

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

Result __thiscall
presolve::HPresolve::removeDependentEquations(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  HPresolveAnalysis *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  vector<int,_std::allocator<int>_> *this_02;
  double dVar1;
  bool bVar2;
  int row;
  int iVar3;
  pointer pdVar4;
  HighsInt HVar5;
  uint uVar6;
  _Rb_tree_node_base *p_Var7;
  pointer piVar8;
  long lVar9;
  size_t __nbytes;
  int iVar10;
  void *__buf;
  void *__buf_00;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  double dVar15;
  double local_8a8;
  HighsPostsolveStack *local_8a0;
  vector<int,_std::allocator<int>_> colSet;
  _Vector_base<int,_std::allocator<int>_> local_878;
  int local_860;
  vector<int,_std::allocator<int>_> eqSet;
  HighsMatrixSlice<HighsTripletTreeSlicePreOrder> local_840;
  HighsSparseMatrix matrix;
  HFactor factor;
  
  if ((this->equations)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    this_00 = &this->analysis_;
    bVar2 = (this->analysis_).logging_on_;
    local_8a0 = postsolve_stack;
    if (bVar2 != false) {
      HPresolveAnalysis::startPresolveRuleLog(this_00,10);
    }
    HighsSparseMatrix::HighsSparseMatrix(&matrix);
    matrix.num_col_ = (HighsInt)(this->equations)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    matrix.num_row_ = this->model->num_col_ + 1;
    std::vector<int,_std::allocator<int>_>::resize(&matrix.start_,(long)(matrix.num_col_ + 1));
    this_01 = &matrix.value_;
    *matrix.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_start = 0;
    HVar5 = numNonzeros(this);
    lVar9 = (long)matrix.num_col_;
    std::vector<double,_std::allocator<double>_>::reserve(this_01,HVar5 + lVar9);
    this_02 = &matrix.index_;
    std::vector<int,_std::allocator<int>_>::reserve(this_02,HVar5 + lVar9);
    std::vector<int,_std::allocator<int>_>::vector
              (&eqSet,(long)matrix.num_col_,(allocator_type *)&factor);
    lVar9 = 0;
    for (p_Var7 = (this->equations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != &(this->equations)._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      iVar10 = *(int *)&p_Var7[1].field_0x4;
      eqSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [lVar9] = iVar10;
      local_840.nodeValue =
           (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_840.nodeIndex =
           (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_840.nodeLeft =
           (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_840.nodeRight =
           (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_840.root =
           (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[iVar10];
      HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::begin((iterator *)&factor,&local_840);
      lVar9 = lVar9 + 1;
      local_878._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_878._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      colSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_878._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      colSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      colSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)0x0;
      local_860 = -1;
      while ((int)factor.col_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish != local_860) {
        local_8a8 = *(double *)factor.build_synthetic_tick;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_01,&local_8a8);
        local_8a8 = (double)CONCAT44(local_8a8._4_4_,*(undefined4 *)factor.build_realTick);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_02,(int *)&local_8a8);
        HighsMatrixSlice<HighsTripletTreeSlicePreOrder>::iterator::operator++((iterator *)&factor);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_878);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)
                 &factor.row_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      pdVar4 = (this->model->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_start;
      dVar1 = pdVar4[iVar10];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        std::vector<double,_std::allocator<double>_>::push_back(this_01,pdVar4 + iVar10);
        std::vector<int,_std::allocator<int>_>::push_back(this_02,&this->model->num_col_);
      }
      matrix.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar9] =
           (int)((ulong)((long)matrix.value_.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)matrix.value_.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3);
    }
    std::vector<int,_std::allocator<int>_>::vector
              (&colSet,(long)matrix.num_col_,(allocator_type *)&factor);
    iVar10 = 0;
    for (piVar8 = colSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar8 != colSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish; piVar8 = piVar8 + 1) {
      *piVar8 = iVar10;
      iVar10 = iVar10 + 1;
    }
    HFactor::HFactor(&factor);
    HFactor::setup(&factor,&matrix,&colSet,0.1,1e-10,0,(HighsLogOptions *)0x0);
    dVar15 = (this->options->super_HighsOptionsStruct).time_limit * 0.01;
    dVar1 = 1000.0;
    if (dVar15 <= 1000.0) {
      dVar1 = dVar15;
    }
    if (dVar1 <= 1.0) {
      dVar1 = 1.0;
    }
    HFactor::setTimeLimit(&factor,dVar1);
    __nbytes = (size_t)(uint)matrix.num_col_;
    highsLogUser(&(this->options->super_HighsOptionsStruct).log_options,kInfo,
                 "Dependent equations search running on %d equations with time limit of %.2fs\n",
                 SUB84(dVar1,0));
    HighsTimer::read(this->timer,0,__buf,__nbytes);
    uVar6 = HFactor::build(&factor,(HighsTimerClock *)0x0);
    HighsTimer::read(this->timer,0,__buf_00,__nbytes);
    dVar15 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) -
             (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    uVar14 = SUB84(dVar15,0);
    if (uVar6 == 0xffffffff) {
      highsLogUser(&(this->options->super_HighsOptionsStruct).log_options,kInfo,
                   "Dependent equations search terminated after %.3gs due to expected time exceeding limit\n"
                   ,uVar14);
      (this->analysis_).logging_on_ = bVar2;
      if (bVar2 != false) {
        HPresolveAnalysis::stopPresolveRuleLog(this_00,0xb);
      }
    }
    else {
      dVar15 = (ABS(dVar15 - dVar1) * 100.0) / dVar1;
      if (dVar15 < 1.0) {
        highsLogUser(&(this->options->super_HighsOptionsStruct).log_options,kWarning,
                     "Dependent equations search finished within %.2f%% of limit of %.2fs: risk of non-deterministic behaviour if solve is repeated\n"
                     ,SUB84(dVar15,0),dVar1);
      }
      uVar11 = 0;
      uVar13 = (ulong)uVar6;
      if ((int)uVar6 < 1) {
        uVar13 = uVar11;
      }
      uVar12 = 0;
      uVar6 = 0;
      iVar10 = 0;
      for (; uVar13 != uVar11; uVar11 = uVar11 + 1) {
        if ((long)factor.var_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar11] < 0) {
          iVar10 = iVar10 + 1;
        }
        else {
          row = eqSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[factor.var_with_no_pivot.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar11]];
          iVar3 = (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[row];
          HighsPostsolveStack::redundantRow(local_8a0,row);
          removeRow(this,row);
          uVar6 = uVar6 + iVar3;
          uVar12 = uVar12 + 1;
        }
      }
      highsLogUser(&(this->options->super_HighsOptionsStruct).log_options,kInfo,
                   "Dependent equations search removed %d rows and %d nonzeros in %.2fs (limit = %.2fs)\n"
                   ,uVar14,dVar1,(ulong)uVar12,(ulong)uVar6);
      if (iVar10 != 0) {
        highsLogDev(&(this->options->super_HighsOptionsStruct).log_options,kInfo,
                    ", avoiding %d fictitious rows");
      }
      highsLogDev(&(this->options->super_HighsOptionsStruct).log_options,kInfo,"\n");
      (this->analysis_).logging_on_ = bVar2;
      if (bVar2 != false) {
        HPresolveAnalysis::stopPresolveRuleLog(this_00,10);
      }
    }
    HFactor::~HFactor(&factor);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&colSet.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&eqSet.super__Vector_base<int,_std::allocator<int>_>);
    HighsSparseMatrix::~HighsSparseMatrix(&matrix);
  }
  return kOk;
}

Assistant:

HPresolve::Result HPresolve::removeDependentEquations(
    HighsPostsolveStack& postsolve_stack) {
  assert(analysis_.allow_rule_[kPresolveRuleDependentEquations]);
  const bool logging_on = analysis_.logging_on_;
  if (equations.empty()) return Result::kOk;

  if (logging_on)
    analysis_.startPresolveRuleLog(kPresolveRuleDependentEquations);

  HighsSparseMatrix matrix;
  matrix.num_col_ = equations.size();
  matrix.num_row_ = model->num_col_ + 1;
  matrix.start_.resize(matrix.num_col_ + 1);
  matrix.start_[0] = 0;
  const HighsInt maxCapacity = numNonzeros() + matrix.num_col_;
  matrix.value_.reserve(maxCapacity);
  matrix.index_.reserve(maxCapacity);

  std::vector<HighsInt> eqSet(matrix.num_col_);
  HighsInt i = 0;
  for (const std::pair<HighsInt, HighsInt>& p : equations) {
    HighsInt eq = p.second;
    eqSet[i++] = eq;

    // add entries of equation
    for (const HighsSliceNonzero& nonz : getRowVector(eq)) {
      matrix.value_.push_back(nonz.value());
      matrix.index_.push_back(nonz.index());
    }

    // add entry for artificial rhs column
    if (model->row_lower_[eq] != 0.0) {
      matrix.value_.push_back(model->row_lower_[eq]);
      matrix.index_.push_back(model->num_col_);
    }

    matrix.start_[i] = matrix.value_.size();
  }
  std::vector<HighsInt> colSet(matrix.num_col_);
  std::iota(colSet.begin(), colSet.end(), 0);
  HFactor factor;
  factor.setup(matrix, colSet);
  // Set up a time limit to prevent the redundant rows factorization
  // taking forever.
  //
  // Allow no more than 1% of the time limit to be spent on removing
  // dependent equations, but ensure that there is some limit since
  // options->time_limit is infinity by default
  //
  // ToDo: This is strictly non-deterministic, but so conservative
  // that it'll only reap the cases when factor.build never finishes
  const double time_limit =
      std::max(1.0, std::min(0.01 * options->time_limit, 1000.0));
  factor.setTimeLimit(time_limit);
  // Determine rank deficiency of the equations
  highsLogUser(options->log_options, HighsLogType::kInfo,
               "Dependent equations search running on %d equations with time "
               "limit of %.2fs\n",
               static_cast<int>(matrix.num_col_), time_limit);
  double time_taken = -this->timer->read();
  HighsInt build_return = factor.build();
  time_taken += this->timer->read();
  if (build_return == kBuildKernelReturnTimeout) {
    // HFactor::build has timed out, so just return
    highsLogUser(options->log_options, HighsLogType::kInfo,
                 "Dependent equations search terminated after %.3gs due to "
                 "expected time exceeding limit\n",
                 time_taken);
    analysis_.logging_on_ = logging_on;
    if (logging_on)
      analysis_.stopPresolveRuleLog(kPresolveRuleDependentFreeCols);
    return Result::kOk;
  } else {
    double pct_off_timeout =
        1e2 * std::fabs(time_taken - time_limit) / time_limit;
    if (pct_off_timeout < 1.0)
      highsLogUser(options->log_options, HighsLogType::kWarning,
                   "Dependent equations search finished within %.2f%% of limit "
                   "of %.2fs: "
                   "risk of non-deterministic behaviour if solve is repeated\n",
                   pct_off_timeout, time_limit);
  }
  // build_return as rank_deficiency must be valid
  assert(build_return >= 0);
  const HighsInt rank_deficiency = build_return;
  // Analyse what's been removed
  HighsInt num_removed_row = 0;
  HighsInt num_removed_nz = 0;
  HighsInt num_fictitious_rows_skipped = 0;
  for (HighsInt k = 0; k < rank_deficiency; k++) {
    if (factor.var_with_no_pivot[k] >= 0) {
      HighsInt redundant_row = eqSet[factor.var_with_no_pivot[k]];
      num_removed_row++;
      num_removed_nz += rowsize[redundant_row];
      postsolve_stack.redundantRow(redundant_row);
      removeRow(redundant_row);
    } else {
      num_fictitious_rows_skipped++;
    }
  }
  highsLogUser(options->log_options, HighsLogType::kInfo,
               "Dependent equations search removed %d rows and %d nonzeros "
               "in %.2fs (limit = %.2fs)\n",
               static_cast<int>(num_removed_row),
               static_cast<int>(num_removed_nz), time_taken, time_limit);
  if (num_fictitious_rows_skipped)
    highsLogDev(options->log_options, HighsLogType::kInfo,
                ", avoiding %d fictitious rows",
                static_cast<int>(num_fictitious_rows_skipped));
  highsLogDev(options->log_options, HighsLogType::kInfo, "\n");

  analysis_.logging_on_ = logging_on;
  if (logging_on)
    analysis_.stopPresolveRuleLog(kPresolveRuleDependentEquations);
  return Result::kOk;
}